

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file_dictionary_handler.c
# Opt level: O2

ion_err_t ffdict_find(ion_dictionary_t *dictionary,ion_predicate_t *predicate,
                     ion_dict_cursor_t **cursor)

{
  byte bVar1;
  ion_err_t iVar2;
  ion_cursor_status_t iVar3;
  ion_dict_cursor_t *piVar4;
  ion_predicate_t *__ptr;
  void *__dest;
  void *pvVar5;
  code *predicate_00;
  size_t __size;
  ion_fpos_t loc;
  ion_flat_file_t *local_58;
  void *local_50;
  ion_flat_file_row_t row;
  
  piVar4 = (ion_dict_cursor_t *)malloc(0x30);
  *cursor = piVar4;
  iVar2 = '\x06';
  if (piVar4 == (ion_dict_cursor_t *)0x0) {
    return '\x06';
  }
  local_58 = (ion_flat_file_t *)dictionary->instance;
  piVar4->dictionary = dictionary;
  piVar4->status = '\x03';
  piVar4->destroy = ffdict_destroy_cursor;
  piVar4->next = ffdict_next;
  __ptr = (ion_predicate_t *)malloc(0x20);
  piVar4->predicate = __ptr;
  if (__ptr == (ion_predicate_t *)0x0) {
LAB_0010668f:
    free(piVar4);
  }
  else {
    bVar1 = predicate->type;
    __ptr->type = bVar1;
    __ptr->destroy = predicate->destroy;
    if (3 < bVar1) {
      return '\x05';
    }
    __size = (size_t)(local_58->super).record.key_size;
    switch(bVar1) {
    case 0:
      pvVar5 = (predicate->statement).range.lower_bound;
      __dest = malloc(__size);
      (__ptr->statement).range.lower_bound = __dest;
      if (__dest == (void *)0x0) goto LAB_00106687;
      memcpy(__dest,pvVar5,__size);
      predicate_00 = flat_file_predicate_key_match;
LAB_001065fc:
      loc = -1;
      iVar2 = flat_file_scan(local_58,-1,&loc,&row,'\x01',predicate_00,pvVar5);
      if (iVar2 == '\0') {
        piVar4 = *cursor;
        piVar4->status = '\x02';
        *(ion_fpos_t *)(piVar4 + 1) = loc;
      }
      else {
        if (iVar2 != '\x0e') {
          return iVar2;
        }
        (*cursor)->status = '\x01';
      }
      break;
    case 1:
      pvVar5 = malloc(__size);
      (__ptr->statement).range.lower_bound = pvVar5;
      if (pvVar5 != (void *)0x0) {
        local_50 = pvVar5;
        memcpy(pvVar5,(predicate->statement).range.lower_bound,__size);
        pvVar5 = malloc(__size);
        (__ptr->statement).range.upper_bound = pvVar5;
        if (pvVar5 != (void *)0x0) {
          memcpy(pvVar5,(predicate->statement).range.upper_bound,__size);
          predicate_00 = flat_file_predicate_within_bounds;
          pvVar5 = local_50;
          goto LAB_001065fc;
        }
        free(local_50);
      }
LAB_00106687:
      free(__ptr);
      goto LAB_0010668f;
    case 2:
      loc = -1;
      iVar2 = flat_file_scan(local_58,-1,&loc,&row,'\x01',flat_file_predicate_not_empty);
      if (iVar2 == '\x0e') {
        iVar3 = '\x01';
      }
      else {
        if (iVar2 != '\0') {
          return iVar2;
        }
        *(ion_fpos_t *)(piVar4 + 1) = loc;
        iVar3 = '\x02';
      }
      (*cursor)->status = iVar3;
    }
    iVar2 = '\0';
  }
  return iVar2;
}

Assistant:

ion_err_t
ffdict_find(
	ion_dictionary_t	*dictionary,
	ion_predicate_t		*predicate,
	ion_dict_cursor_t	**cursor
) {
	*cursor = malloc(sizeof(ion_flat_file_cursor_t));

	ion_flat_file_t *flat_file = (ion_flat_file_t *) dictionary->instance;

	if (NULL == *cursor) {
		return err_out_of_memory;
	}

	(*cursor)->dictionary	= dictionary;
	(*cursor)->status		= cs_cursor_uninitialized;

	(*cursor)->destroy		= ffdict_destroy_cursor;
	(*cursor)->next			= ffdict_next;

	(*cursor)->predicate	= malloc(sizeof(ion_predicate_t));

	if (NULL == (*cursor)->predicate) {
		free(*cursor);
		return err_out_of_memory;
	}

	(*cursor)->predicate->type		= predicate->type;
	(*cursor)->predicate->destroy	= predicate->destroy;

	ion_key_size_t key_size = dictionary->instance->record.key_size;

	switch (predicate->type) {
		case predicate_equality: {
			ion_key_t target_key = predicate->statement.equality.equality_value;

			(*cursor)->predicate->statement.equality.equality_value = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.equality.equality_value) {
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.equality.equality_value, target_key, key_size);

			ion_fpos_t			loc			= -1;
			ion_flat_file_row_t row;
			ion_err_t			scan_result = flat_file_scan(flat_file, -1, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, target_key);

			if (err_file_hit_eof == scan_result) {
				/* If this happens, that means the target key doesn't exist */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else if (err_ok == scan_result) {
				(*cursor)->status = cs_cursor_initialized;

				ion_flat_file_cursor_t *flat_file_cursor = (ion_flat_file_cursor_t *) (*cursor);

				flat_file_cursor->current_location = loc;
				return err_ok;
			}
			else {
				/* File scan hit an error condition */
				return scan_result;
			}

			break;
		}

		case predicate_range: {
			(*cursor)->predicate->statement.range.lower_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.lower_bound) {
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.lower_bound, predicate->statement.range.lower_bound, key_size);

			(*cursor)->predicate->statement.range.upper_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.upper_bound) {
				free((*cursor)->predicate->statement.range.lower_bound);
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.upper_bound, predicate->statement.range.upper_bound, key_size);

			/* Find the first satisfactory key. */
			ion_fpos_t			loc			= -1;
			ion_flat_file_row_t row;
			ion_err_t			scan_result = flat_file_scan(flat_file, -1, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_within_bounds, (*cursor)->predicate->statement.range.lower_bound, (*cursor)->predicate->statement.range.upper_bound);

			if (err_file_hit_eof == scan_result) {
				/* This means the returned node is smaller than the lower bound, which means that there are no valid records to return */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else if (err_ok == scan_result) {
				(*cursor)->status = cs_cursor_initialized;

				ion_flat_file_cursor_t *flat_file_cursor = (ion_flat_file_cursor_t *) (*cursor);

				flat_file_cursor->current_location = loc;
				return err_ok;
			}
			else {
				/* Scan failed due to external error */
				return scan_result;
			}

			break;
		}

		case predicate_all_records: {
			ion_flat_file_cursor_t *flat_file_cursor	= (ion_flat_file_cursor_t *) (*cursor);

			ion_fpos_t			loc						= -1;
			ion_flat_file_row_t row;
			ion_err_t			scan_result				= flat_file_scan(flat_file, -1, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_not_empty);

			if (err_file_hit_eof == scan_result) {
				(*cursor)->status = cs_end_of_results;
			}
			else if (err_ok == scan_result) {
				flat_file_cursor->current_location	= loc;
				(*cursor)->status					= cs_cursor_initialized;
			}
			else {
				/* Scan failure */
				return scan_result;
			}

			return err_ok;
			break;
		}

		case predicate_predicate: {
			break;
		}

		default: {
			return err_invalid_predicate;
			break;
		}
	}

	return err_ok;
}